

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layer.cpp
# Opt level: O2

void __thiscall ncnn::Layer::~Layer(Layer *this)

{
  this->_vptr_Layer = (_func_int **)&PTR__Layer_00190710;
  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector(&this->top_shapes);
  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector(&this->bottom_shapes);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&(this->tops).super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&(this->bottoms).super__Vector_base<int,_std::allocator<int>_>);
  std::__cxx11::string::~string((string *)&this->name);
  std::__cxx11::string::~string((string *)&this->type);
  return;
}

Assistant:

Layer::~Layer()
{
}